

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

RepeatedFieldRef<google::protobuf::Message,_void> * __thiscall
google::protobuf::Reflection::GetRepeatedFieldRef<google::protobuf::Message>
          (RepeatedFieldRef<google::protobuf::Message,_void> *__return_storage_ptr__,
          Reflection *this,Message *message,FieldDescriptor *field)

{
  Nullable<const_char_*> failure_msg;
  Metadata MVar1;
  Reflection *local_38 [2];
  Reflection *local_28;
  
  MVar1 = Message::GetMetadata(message);
  local_38[0] = MVar1.reflection;
  local_28 = this;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                          (local_38,&local_28,"message.GetReflection() == this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    RepeatedFieldRef<google::protobuf::Message,_void>::RepeatedFieldRef
              (__return_storage_ptr__,message,field);
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x715,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38);
}

Assistant:

RepeatedFieldRef<T> Reflection::GetRepeatedFieldRef(
    const Message& message, const FieldDescriptor* field) const {
  ABSL_DCHECK_EQ(message.GetReflection(), this);
  return RepeatedFieldRef<T>(message, field);
}